

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LicenseReader.cpp
# Opt level: O0

EventRegistry * __thiscall
license::LicenseReader::readLicenses
          (EventRegistry *__return_storage_ptr__,LicenseReader *this,string *product,
          vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>
          *licenseInfoOut)

{
  bool bVar1;
  bool bVar2;
  undefined4 licenseVersion;
  bool bVar3;
  bool bVar4;
  SI_Error SVar5;
  int iVar6;
  char *pcVar7;
  reference pbVar8;
  char *pcVar9;
  char *pcVar10;
  long lVar11;
  long lVar12;
  string local_390;
  string local_370;
  allocator local_349;
  string local_348;
  undefined1 local_328 [8];
  FullLicenseInfo licInfo;
  string local_220;
  undefined1 local_200 [8];
  string extra_data;
  int to_sw_version;
  int from_sw_version;
  undefined1 local_1b0 [8];
  string client_signature;
  string local_188;
  undefined1 local_168 [8];
  string to_date;
  string local_140;
  undefined1 local_120 [8];
  string from_date;
  long license_version;
  char *license_signature;
  int sectionSize;
  char *productNamePtr;
  iterator iStack_d8;
  SI_Error rc;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_d0;
  iterator it;
  CSimpleIniA ini;
  bool atLeastOneLicenseComplete;
  bool atLeastOneProductLicensed;
  bool loadAtLeastOneFile;
  undefined1 local_40 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  diskFiles;
  vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_> *licenseInfoOut_local;
  string *product_local;
  LicenseReader *this_local;
  EventRegistry *result;
  
  diskFiles.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)licenseInfoOut;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_40);
  getLicenseDiskFiles(__return_storage_ptr__,this,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_40);
  bVar3 = EventRegistry::isGood(__return_storage_ptr__);
  if (bVar3) {
    bVar3 = false;
    bVar1 = false;
    bVar2 = false;
    CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::CSimpleIniTempl
              ((CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *)&it,false,false,
               false);
    local_d0._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_40);
    while( true ) {
      iStack_d8 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_40);
      bVar4 = __gnu_cxx::operator!=(&local_d0,&stack0xffffffffffffff28);
      if (!bVar4) break;
      CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Reset
                ((CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *)&it);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator*(&local_d0);
      pcVar7 = (char *)std::__cxx11::string::c_str();
      SVar5 = CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::LoadFile
                        ((CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *)&it,
                         pcVar7);
      if (SVar5 < SI_OK) {
        pbVar8 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_d0);
        EventRegistry::addEvent(__return_storage_ptr__,FILE_FORMAT_NOT_RECOGNIZED,SVRT_WARN,pbVar8);
      }
      else {
        bVar3 = true;
        pcVar7 = (char *)std::__cxx11::string::c_str();
        iVar6 = CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::GetSectionSize
                          ((CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *)&it,
                           pcVar7);
        if (iVar6 < 1) {
          pbVar8 = __gnu_cxx::
                   __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&local_d0);
          EventRegistry::addEvent(__return_storage_ptr__,PRODUCT_NOT_LICENSED,SVRT_WARN,pbVar8);
        }
        else {
          bVar1 = true;
          pcVar9 = CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::GetValue
                             ((CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *)
                              &it,pcVar7,"license_signature",(char *)0x0,(bool *)0x0);
          from_date.field_2._8_8_ =
               CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::GetLongValue
                         ((CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *)&it,
                          pcVar7,"license_version",-1,(bool *)0x0);
          if ((pcVar9 == (char *)0x0) || ((long)from_date.field_2._8_8_ < 1)) {
            pbVar8 = __gnu_cxx::
                     __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator*(&local_d0);
            EventRegistry::addEvent(__return_storage_ptr__,LICENSE_MALFORMED,SVRT_WARN,pbVar8);
          }
          else {
            pcVar10 = CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::GetValue
                                ((CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>
                                  *)&it,pcVar7,"from_date",FullLicenseInfo::UNUSED_TIME,(bool *)0x0)
            ;
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_140,pcVar10,
                       (allocator *)(to_date.field_2._M_local_buf + 0xf));
            trim_copy((string *)local_120,&local_140);
            std::__cxx11::string::~string((string *)&local_140);
            std::allocator<char>::~allocator
                      ((allocator<char> *)(to_date.field_2._M_local_buf + 0xf));
            pcVar10 = CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::GetValue
                                ((CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>
                                  *)&it,pcVar7,"to_date",FullLicenseInfo::UNUSED_TIME,(bool *)0x0);
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_188,pcVar10,
                       (allocator *)(client_signature.field_2._M_local_buf + 0xf));
            trim_copy((string *)local_168,&local_188);
            std::__cxx11::string::~string((string *)&local_188);
            std::allocator<char>::~allocator
                      ((allocator<char> *)(client_signature.field_2._M_local_buf + 0xf));
            pcVar10 = CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::GetValue
                                ((CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>
                                  *)&it,pcVar7,"client_signature","",(bool *)0x0);
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&from_sw_version,pcVar10,(allocator *)((long)&to_sw_version + 3));
            trim_copy((string *)local_1b0,(string *)&from_sw_version);
            std::__cxx11::string::~string((string *)&from_sw_version);
            std::allocator<char>::~allocator((allocator<char> *)((long)&to_sw_version + 3));
            lVar11 = CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::GetLongValue
                               ((CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *
                                )&it,pcVar7,"from_sw_version",0,(bool *)0x0);
            lVar12 = CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::GetLongValue
                               ((CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *
                                )&it,pcVar7,"to_sw_version",0,(bool *)0x0);
            extra_data.field_2._12_4_ = (undefined4)lVar12;
            pcVar7 = CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::GetValue
                               ((CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *
                                )&it,pcVar7,"extra_data","",(bool *)0x0);
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_220,pcVar7,
                       (allocator *)(licInfo.extra_data.field_2._M_local_buf + 0xf));
            trim_copy((string *)local_200,&local_220);
            std::__cxx11::string::~string((string *)&local_220);
            std::allocator<char>::~allocator
                      ((allocator<char> *)(licInfo.extra_data.field_2._M_local_buf + 0xf));
            pbVar8 = __gnu_cxx::
                     __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator*(&local_d0);
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_348,pcVar9,&local_349);
            licenseVersion = from_date.field_2._8_4_;
            std::__cxx11::string::string((string *)&local_370,(string *)local_120);
            std::__cxx11::string::string((string *)&local_390,(string *)local_168);
            FullLicenseInfo::FullLicenseInfo
                      ((FullLicenseInfo *)local_328,pbVar8,product,&local_348,licenseVersion,
                       &local_370,&local_390,(string *)local_1b0,(uint)lVar11,
                       extra_data.field_2._12_4_,(string *)local_200);
            std::__cxx11::string::~string((string *)&local_390);
            std::__cxx11::string::~string((string *)&local_370);
            std::__cxx11::string::~string((string *)&local_348);
            std::allocator<char>::~allocator((allocator<char> *)&local_349);
            std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>::
            push_back((vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_> *
                      )diskFiles.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_328);
            bVar2 = true;
            FullLicenseInfo::~FullLicenseInfo((FullLicenseInfo *)local_328);
            std::__cxx11::string::~string((string *)local_200);
            std::__cxx11::string::~string((string *)local_1b0);
            std::__cxx11::string::~string((string *)local_168);
            std::__cxx11::string::~string((string *)local_120);
          }
        }
      }
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_d0,0);
    }
    if (!bVar3) {
      EventRegistry::turnEventIntoError(__return_storage_ptr__,FILE_FORMAT_NOT_RECOGNIZED);
    }
    if (!bVar1) {
      EventRegistry::turnEventIntoError(__return_storage_ptr__,PRODUCT_NOT_LICENSED);
    }
    if (!bVar2) {
      EventRegistry::turnEventIntoError(__return_storage_ptr__,LICENSE_MALFORMED);
    }
    CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::~CSimpleIniTempl
              ((CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *)&it);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_40);
  return __return_storage_ptr__;
}

Assistant:

EventRegistry LicenseReader::readLicenses(const string &product,
		vector<FullLicenseInfo>& licenseInfoOut) {
	vector<string> diskFiles;
	EventRegistry result = getLicenseDiskFiles(diskFiles);
	if (!result.isGood()) {
		return result;
	}
	bool loadAtLeastOneFile = false;
	bool atLeastOneProductLicensed = false;
	bool atLeastOneLicenseComplete = false;
	CSimpleIniA ini;
	for (auto it = diskFiles.begin(); it != diskFiles.end(); it++) {
		ini.Reset();
		SI_Error rc = ini.LoadFile((*it).c_str());
		if (rc < 0) {
			result.addEvent(FILE_FORMAT_NOT_RECOGNIZED, SVRT_WARN, *it);
			continue;
		} else {
			loadAtLeastOneFile = true;
		}
		const char* productNamePtr = product.c_str();
		int sectionSize = ini.GetSectionSize(productNamePtr);
		if (sectionSize <= 0) {
			result.addEvent(PRODUCT_NOT_LICENSED, SVRT_WARN, *it);
			continue;
		} else {
			atLeastOneProductLicensed = true;
		}
		/*
		 *  sw_version_from = (optional int)
		 *  sw_version_to = (optional int)
		 *  from_date = YYYY-MM-DD (optional)
		 *  to_date  = YYYY-MM-DD (optional)
		 *  client_signature = XXXX-XXXX-XXXX-XXXX (optional string 16)
		 *  license_signature = XXXXXXXXXX (mandatory, 1024)
		 *  application_data = xxxxxxxxx (optional string 16)
		 */
		const char * license_signature = ini.GetValue(productNamePtr,
				"license_signature", NULL);
		long license_version = ini.GetLongValue(productNamePtr,
				"license_version", -1);
		if (license_signature != NULL && license_version > 0) {
			string from_date = trim_copy(
					ini.GetValue(productNamePtr, "from_date",
							FullLicenseInfo::UNUSED_TIME));
			string to_date = trim_copy(
					ini.GetValue(productNamePtr, "to_date",
							FullLicenseInfo::UNUSED_TIME));
			string client_signature = trim_copy(
					ini.GetValue(productNamePtr, "client_signature", ""));
			/*client_signature.erase(
			 std::remove(client_signature.begin(), client_signature.end(), '-'),
			 client_signature.end());*/
			int from_sw_version = ini.GetLongValue(productNamePtr,
					"from_sw_version",
					FullLicenseInfo::UNUSED_SOFTWARE_VERSION);
			int to_sw_version = ini.GetLongValue(productNamePtr,
					"to_sw_version", FullLicenseInfo::UNUSED_SOFTWARE_VERSION);
			string extra_data = trim_copy(
					ini.GetValue(productNamePtr, "extra_data", ""));
			FullLicenseInfo licInfo(*it, product, license_signature,
					(int) license_version, from_date, to_date, client_signature,
					from_sw_version, to_sw_version, extra_data);
			licenseInfoOut.push_back(licInfo);
			atLeastOneLicenseComplete = true;
		} else {
			result.addEvent(LICENSE_MALFORMED, SVRT_WARN, *it);
		}
	}
	if (!loadAtLeastOneFile) {
		result.turnEventIntoError(FILE_FORMAT_NOT_RECOGNIZED);
	}
	if (!atLeastOneProductLicensed) {
		result.turnEventIntoError(PRODUCT_NOT_LICENSED);
	}
	if (!atLeastOneLicenseComplete) {
		result.turnEventIntoError(LICENSE_MALFORMED);
	}
	return result;
}